

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlOutputBufferWriteEscape
              (xmlOutputBufferPtr out,xmlChar *str,xmlCharEncodingOutputFunc escaping)

{
  xmlOutputWriteCallback p_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  xmlBufPtr pxVar7;
  xmlChar *pxVar8;
  xmlBufPtr *ppxVar9;
  int iVar10;
  xmlBufPtr *ppxVar11;
  int cons;
  int chunk;
  xmlBufPtr *local_58;
  void *local_50;
  xmlCharEncodingOutputFunc local_48;
  xmlBufPtr *local_40;
  size_t local_38;
  
  iVar10 = -1;
  if ((((out != (xmlOutputBufferPtr)0x0) && (str != (xmlChar *)0x0)) && (out->error == 0)) &&
     ((out->buffer != (xmlBufPtr)0x0 && (iVar2 = xmlBufGetAllocationScheme(out->buffer), iVar2 != 2)
      ))) {
    sVar5 = strlen((char *)str);
    if ((int)sVar5 < 0) {
      iVar10 = 0;
    }
    else if (out->error == 0) {
      local_48 = xmlEscapeContent;
      if (escaping != (xmlCharEncodingOutputFunc)0x0) {
        local_48 = escaping;
      }
      local_58 = &out->buffer;
      ppxVar11 = &out->conv;
      iVar10 = 0;
      local_40 = ppxVar11;
      while( true ) {
        ppxVar9 = local_58;
        iVar2 = (int)sVar5;
        cons = iVar2;
        sVar6 = xmlBufAvail(*local_58);
        chunk = (int)sVar6;
        if (0x27 < chunk) break;
        iVar3 = xmlBufGrow(*ppxVar9,100);
        iVar2 = -1;
        if (iVar3 < 0) goto LAB_00193b03;
LAB_00193add:
        if ((int)sVar5 < 1) {
          return iVar10;
        }
        if (iVar2 == iVar10) {
          return iVar10;
        }
      }
      if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        pxVar8 = xmlBufEnd(*ppxVar9);
        iVar3 = (*local_48)(pxVar8,&chunk,str,&cons);
        if ((-1 < iVar3) && (chunk != 0)) {
          xmlBufAddLen(out->buffer,(long)chunk);
          iVar3 = chunk;
          if (out->writecallback == (xmlOutputWriteCallback)0x0) goto LAB_00193a54;
LAB_001939dd:
          sVar6 = xmlBufUse(*ppxVar9);
          ppxVar11 = local_40;
          iVar3 = (int)sVar6;
          p_Var1 = out->writecallback;
          str = str + cons;
          sVar5 = (size_t)(uint)(iVar2 - cons);
          if (p_Var1 == (xmlOutputWriteCallback)0x0) goto LAB_00193a5f;
          if ((iVar3 < 4000) && (iVar2 - cons < 1)) {
            return iVar10;
          }
          local_50 = out->context;
          if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
            pxVar8 = xmlBufContent(*local_58);
            uVar4 = (*p_Var1)(local_50,(char *)pxVar8,iVar3);
            ppxVar11 = local_58;
          }
          else {
            local_38 = sVar5;
            pxVar8 = xmlBufContent(*local_40);
            uVar4 = (*p_Var1)(local_50,(char *)pxVar8,iVar3);
            sVar5 = local_38;
          }
          if ((int)uVar4 < 0) {
            iVar10 = 0x60a;
LAB_00193b1f:
            xmlIOErr(iVar10,(char *)0x0);
            out->error = iVar10;
            return uVar4;
          }
          xmlBufShrink(*ppxVar11,(ulong)uVar4);
          if ((int)(uVar4 ^ 0x7fffffff) < out->written) {
            out->written = 0x7fffffff;
          }
          else {
            out->written = out->written + uVar4;
          }
          goto LAB_00193ad5;
        }
      }
      else {
        if (*ppxVar11 == (xmlBufPtr)0x0) {
          pxVar7 = xmlBufCreate();
          *ppxVar11 = pxVar7;
        }
        pxVar8 = xmlBufEnd(*ppxVar9);
        iVar3 = (*local_48)(pxVar8,&chunk,str,&cons);
        if ((-1 < iVar3) && (chunk != 0)) {
          xmlBufAddLen(*ppxVar9,(long)chunk);
          sVar6 = xmlBufUse(*ppxVar9);
          if ((sVar6 < 4000) && (cons == iVar2)) {
            return iVar10;
          }
          iVar3 = xmlCharEncOutput(out,0);
          if (iVar3 < 0 && iVar3 != -3) {
            iVar10 = 0x608;
            uVar4 = 0xffffffff;
            goto LAB_00193b1f;
          }
          ppxVar9 = ppxVar11;
          if (out->writecallback != (xmlOutputWriteCallback)0x0) goto LAB_001939dd;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
LAB_00193a54:
          str = str + cons;
          sVar5 = (size_t)(uint)(iVar2 - cons);
LAB_00193a5f:
          ppxVar11 = local_58;
          sVar6 = xmlBufAvail(*local_58);
          if (sVar6 < 4000) {
            xmlBufGrow(*ppxVar11,4000);
          }
LAB_00193ad5:
          ppxVar11 = local_40;
          iVar2 = iVar10;
          iVar10 = iVar3 + iVar10;
          goto LAB_00193add;
        }
      }
LAB_00193b03:
      iVar10 = -1;
    }
  }
  return iVar10;
}

Assistant:

int
xmlOutputBufferWriteEscape(xmlOutputBufferPtr out, const xmlChar *str,
                           xmlCharEncodingOutputFunc escaping) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int oldwritten=0;/* loop guard */
    int chunk;       /* number of byte currently processed from str */
    int len;         /* number of bytes in str */
    int cons;        /* byte from str consumed */

    if ((out == NULL) || (out->error) || (str == NULL) ||
        (out->buffer == NULL) ||
	(xmlBufGetAllocationScheme(out->buffer) == XML_BUFFER_ALLOC_IMMUTABLE))
        return(-1);
    len = strlen((const char *)str);
    if (len < 0) return(0);
    if (out->error) return(-1);
    if (escaping == NULL) escaping = xmlEscapeContent;

    do {
        oldwritten = written;

        /*
	 * how many bytes to consume and how many bytes to store.
	 */
	cons = len;
	chunk = xmlBufAvail(out->buffer);

        /*
	 * make sure we have enough room to save first, if this is
	 * not the case force a flush, but make sure we stay in the loop
	 */
	if (chunk < 40) {
	    if (xmlBufGrow(out->buffer, 100) < 0)
	        return(-1);
            oldwritten = -1;
	    continue;
	}

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = escaping(xmlBufEnd(out->buffer) ,
	                   &chunk, str, &cons);
	    if ((ret < 0) || (chunk == 0)) /* chunk==0 => nothing done */
	        return(-1);
            xmlBufAddLen(out->buffer, chunk);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (cons == len))
		goto done;

	    /*
	     * convert as much as possible to the output buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            if (out->writecallback)
	        nbchars = xmlBufUse(out->conv);
            else
                nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = escaping(xmlBufEnd(out->buffer), &chunk, str, &cons);
	    if ((ret < 0) || (chunk == 0)) /* chunk==0 => nothing done */
	        return(-1);
            xmlBufAddLen(out->buffer, chunk);
            if (out->writecallback)
	        nbchars = xmlBufUse(out->buffer);
            else
                nbchars = chunk;
	}
	str += cons;
	len -= cons;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	} else if (xmlBufAvail(out->buffer) < MINLEN) {
	    xmlBufGrow(out->buffer, MINLEN);
	}
	written += nbchars;
    } while ((len > 0) && (oldwritten != written));

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}